

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QList<QByteArray> * __thiscall
QTzTimeZonePrivate::availableTimeZoneIds
          (QList<QByteArray> *__return_storage_ptr__,QTzTimeZonePrivate *this)

{
  Type *this_00;
  iterator iVar1;
  iterator iVar2;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
                      ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>
                        *)__return_storage_ptr__);
  QHash<QByteArray,_QTzTimeZone>::keys(__return_storage_ptr__,this_00);
  iVar1 = QList<QByteArray>::begin(__return_storage_ptr__);
  iVar2 = QList<QByteArray>::end(__return_storage_ptr__);
  std::__sort<QList<QByteArray>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar1.i,iVar2.i);
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QTzTimeZonePrivate::availableTimeZoneIds() const
{
    QList<QByteArray> result = tzZones->keys();
    std::sort(result.begin(), result.end());
    return result;
}